

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void pinger_write_ping(pinger_t *pinger)

{
  int iVar1;
  uv_buf_t uVar2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  char *local_98;
  char *local_90;
  char *local_88;
  uint local_80;
  int local_7c;
  int nbufs;
  int i;
  uv_buf_t bufs [5];
  uv_write_t *req;
  uv_stream_t *stream;
  pinger_t *pinger_local;
  
  if (pinger->vectored_writes == 0) {
    local_80 = 1;
    uVar2 = uv_buf_init(PING,5);
    local_90 = uVar2.base;
    _nbufs = local_90;
    local_88 = (char *)uVar2.len;
    bufs[0].base = local_88;
  }
  else {
    local_80 = 5;
    for (local_7c = 0; local_7c < 5; local_7c = local_7c + 1) {
      uVar2 = uv_buf_init(PING + local_7c,1);
      eval_a = uVar2.base;
      *(void **)(&nbufs + (long)local_7c * 4) = eval_a;
      local_98 = (char *)uVar2.len;
      bufs[local_7c].base = local_98;
    }
  }
  bufs[4].len = (size_t)malloc(200);
  if ((uv_write_t *)bufs[4].len != (uv_write_t *)0x0) {
    ((uv_write_t *)bufs[4].len)->data = (void *)0x0;
    iVar1 = uv_write((uv_write_t *)bufs[4].len,(uv_stream_t *)&(pinger->stream).tcp,
                     (uv_buf_t *)&nbufs,local_80,pinger_after_write);
    if ((long)iVar1 == 0) {
      puts("PING");
      return;
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x73,"uv_write(req, stream, bufs, nbufs, pinger_after_write)","==","0",(long)iVar1,"=="
            ,0);
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
          ,0x71,"req","!=","NULL",0,"!=",0);
  abort();
}

Assistant:

static void pinger_write_ping(pinger_t* pinger) {
  uv_stream_t* stream;
  uv_write_t* req;
  uv_buf_t bufs[sizeof PING - 1];
  int i, nbufs;

  stream = (uv_stream_t*) &pinger->stream.tcp;

  if (!pinger->vectored_writes) {
    /* Write a single buffer. */
    nbufs = 1;
    bufs[0] = uv_buf_init(PING, sizeof PING - 1);
  } else {
    /* Write multiple buffers, each with one byte in them. */
    nbufs = sizeof PING - 1;
    for (i = 0; i < nbufs; i++) {
      bufs[i] = uv_buf_init(&PING[i], 1);
    }
  }

  req = malloc(sizeof(*req));
  ASSERT_NOT_NULL(req);
  req->data = NULL;
  ASSERT_OK(uv_write(req, stream, bufs, nbufs, pinger_after_write));

  puts("PING");
}